

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::cm
          (AbstractContentContext *this,double inA,double inB,double inC,double inD,double inE,
          double inF)

{
  EStatusCode EVar1;
  PrimitiveObjectsWriter *this_00;
  allocator<char> local_61;
  string local_60;
  double local_40;
  double inF_local;
  double inE_local;
  double inD_local;
  double inC_local;
  double inB_local;
  double inA_local;
  AbstractContentContext *this_local;
  
  local_40 = inF;
  inF_local = inE;
  inE_local = inD;
  inD_local = inC;
  inC_local = inB;
  inB_local = inA;
  inA_local = (double)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteDouble(this_00,inB_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inC_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inD_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inE_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inF_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_40,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"cm",&local_61);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::cm(double inA, double inB, double inC, double inD, double inE, double inF)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteDouble(inA);
	mPrimitiveWriter.WriteDouble(inB);
	mPrimitiveWriter.WriteDouble(inC);
	mPrimitiveWriter.WriteDouble(inD);
	mPrimitiveWriter.WriteDouble(inE);
	mPrimitiveWriter.WriteDouble(inF);
	mPrimitiveWriter.WriteKeyword("cm");
	return GetCurrentStatusCode();
}